

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppDocuments(bool *p_open)

{
  bool bVar1;
  int iVar2;
  MyDocument *pMVar3;
  MyDocument **ppMVar4;
  ImVec2 local_a0;
  int local_98;
  int n_4;
  int local_8c;
  int n_3;
  int local_80;
  int local_7c;
  int n_2;
  int n_1;
  int n;
  int close_queue_unsaved_documents;
  MyDocument *doc_3;
  byte local_5d;
  int doc_n_5;
  bool visible;
  MyDocument *pMStack_58;
  ImGuiTabItemFlags tab_flags;
  MyDocument *doc_2;
  int doc_n_4;
  ImGuiTabBarFlags tab_bar_flags;
  MyDocument *doc_1;
  int doc_n_3;
  int doc_n_2;
  MyDocument *doc;
  int local_28;
  int doc_n_1;
  int doc_n;
  int open_count;
  bool window_contents_visible;
  bool *local_10;
  bool *p_open_local;
  
  local_10 = p_open;
  if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar2 != 0)) {
    ExampleAppDocuments::ExampleAppDocuments(&ShowExampleAppDocuments::app);
    __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments::app,
                 &__dso_handle);
    __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
  }
  doc_n._3_1_ = ImGui::Begin("Example: Documents",local_10,0x400);
  if ((bool)doc_n._3_1_) {
    bVar1 = ImGui::BeginMenuBar();
    if (bVar1) {
      bVar1 = ImGui::BeginMenu("File",true);
      if (bVar1) {
        doc_n_1 = 0;
        for (local_28 = 0; local_28 < ShowExampleAppDocuments::app.Documents.Size;
            local_28 = local_28 + 1) {
          pMVar3 = ImVector<MyDocument>::operator[]
                             (&ShowExampleAppDocuments::app.Documents,local_28);
          doc_n_1 = (uint)((pMVar3->Open & 1U) != 0) + doc_n_1;
        }
        bVar1 = ImGui::BeginMenu("Open",doc_n_1 < ShowExampleAppDocuments::app.Documents.Size);
        if (bVar1) {
          for (doc._4_4_ = 0; doc._4_4_ < ShowExampleAppDocuments::app.Documents.Size;
              doc._4_4_ = doc._4_4_ + 1) {
            _doc_n_3 = ImVector<MyDocument>::operator[]
                                 (&ShowExampleAppDocuments::app.Documents,doc._4_4_);
            if (((_doc_n_3->Open & 1U) == 0) &&
               (bVar1 = ImGui::MenuItem(_doc_n_3->Name,(char *)0x0,false,true), bVar1)) {
              MyDocument::DoOpen(_doc_n_3);
            }
          }
          ImGui::EndMenu();
        }
        bVar1 = ImGui::MenuItem("Close All Documents",(char *)0x0,false,0 < doc_n_1);
        if (bVar1) {
          for (doc_1._4_4_ = 0; doc_1._4_4_ < ShowExampleAppDocuments::app.Documents.Size;
              doc_1._4_4_ = doc_1._4_4_ + 1) {
            pMVar3 = ImVector<MyDocument>::operator[]
                               (&ShowExampleAppDocuments::app.Documents,doc_1._4_4_);
            MyDocument::DoQueueClose(pMVar3);
          }
        }
        ImGui::MenuItem("Exit","Alt+F4",false,true);
        ImGui::EndMenu();
      }
      ImGui::EndMenuBar();
    }
    for (doc_1._0_4_ = 0; (int)doc_1 < ShowExampleAppDocuments::app.Documents.Size;
        doc_1._0_4_ = (int)doc_1 + 1) {
      _doc_n_4 = ImVector<MyDocument>::operator[]
                           (&ShowExampleAppDocuments::app.Documents,(int)doc_1);
      if (0 < (int)doc_1) {
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::PushID(_doc_n_4);
      bVar1 = ImGui::Checkbox(_doc_n_4->Name,&_doc_n_4->Open);
      if ((bVar1) && ((_doc_n_4->Open & 1U) == 0)) {
        MyDocument::DoForceClose(_doc_n_4);
      }
      ImGui::PopID();
    }
    ImGui::Separator();
    doc_2._4_4_ = ShowExampleAppDocuments::opt_fitting_flags |
                  (uint)((ShowExampleAppDocuments::opt_reorderable & 1U) != 0);
    bVar1 = ImGui::BeginTabBar("##tabs",doc_2._4_4_);
    if (bVar1) {
      if ((ShowExampleAppDocuments::opt_reorderable & 1U) != 0) {
        NotifyOfDocumentsClosedElsewhere(&ShowExampleAppDocuments::app);
      }
      for (doc_2._0_4_ = 0; (int)doc_2 < ShowExampleAppDocuments::app.Documents.Size;
          doc_2._0_4_ = (int)doc_2 + 1) {
        pMStack_58 = ImVector<MyDocument>::operator[]
                               (&ShowExampleAppDocuments::app.Documents,(int)doc_2);
        if ((pMStack_58->Open & 1U) != 0) {
          doc_n_5 = (int)((pMStack_58->Dirty & 1U) != 0);
          local_5d = ImGui::BeginTabItem(pMStack_58->Name,&pMStack_58->Open,doc_n_5);
          if (((pMStack_58->Open & 1U) == 0) && ((pMStack_58->Dirty & 1U) != 0)) {
            pMStack_58->Open = true;
            MyDocument::DoQueueClose(pMStack_58);
          }
          MyDocument::DisplayContextMenu(pMStack_58);
          if ((local_5d & 1) != 0) {
            MyDocument::DisplayContents(pMStack_58);
            ImGui::EndTabItem();
          }
        }
      }
      ImGui::EndTabBar();
    }
    if ((ShowExampleAppDocuments(bool*)::close_queue == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::close_queue), iVar2 != 0)) {
      ImVector<MyDocument_*>::ImVector(&ShowExampleAppDocuments::close_queue);
      __cxa_atexit(ImVector<MyDocument_*>::~ImVector,&ShowExampleAppDocuments::close_queue,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::close_queue);
    }
    bVar1 = ImVector<MyDocument_*>::empty(&ShowExampleAppDocuments::close_queue);
    if (bVar1) {
      for (doc_3._4_4_ = 0; doc_3._4_4_ < ShowExampleAppDocuments::app.Documents.Size;
          doc_3._4_4_ = doc_3._4_4_ + 1) {
        _n = ImVector<MyDocument>::operator[](&ShowExampleAppDocuments::app.Documents,doc_3._4_4_);
        if ((_n->WantClose & 1U) != 0) {
          _n->WantClose = false;
          ImVector<MyDocument_*>::push_back(&ShowExampleAppDocuments::close_queue,(MyDocument **)&n)
          ;
        }
      }
    }
    bVar1 = ImVector<MyDocument_*>::empty(&ShowExampleAppDocuments::close_queue);
    if (!bVar1) {
      n_1 = 0;
      for (n_2 = 0; n_2 < ShowExampleAppDocuments::close_queue.Size; n_2 = n_2 + 1) {
        ppMVar4 = ImVector<MyDocument_*>::operator[](&ShowExampleAppDocuments::close_queue,n_2);
        if (((*ppMVar4)->Dirty & 1U) != 0) {
          n_1 = n_1 + 1;
        }
      }
      if (n_1 == 0) {
        for (local_7c = 0; local_7c < ShowExampleAppDocuments::close_queue.Size;
            local_7c = local_7c + 1) {
          ppMVar4 = ImVector<MyDocument_*>::operator[]
                              (&ShowExampleAppDocuments::close_queue,local_7c);
          MyDocument::DoForceClose(*ppMVar4);
        }
        ImVector<MyDocument_*>::clear(&ShowExampleAppDocuments::close_queue);
      }
      else {
        bVar1 = ImGui::IsPopupOpen("Save?");
        if (!bVar1) {
          ImGui::OpenPopup("Save?");
        }
        bVar1 = ImGui::BeginPopupModal("Save?",(bool *)0x0,0);
        if (bVar1) {
          ImGui::Text("Save change to the following items?");
          ImGui::SetNextItemWidth(-1.0);
          bVar1 = ImGui::ListBoxHeader("##",n_1,6);
          if (bVar1) {
            for (local_80 = 0; local_80 < ShowExampleAppDocuments::close_queue.Size;
                local_80 = local_80 + 1) {
              ppMVar4 = ImVector<MyDocument_*>::operator[]
                                  (&ShowExampleAppDocuments::close_queue,local_80);
              if (((*ppMVar4)->Dirty & 1U) != 0) {
                ppMVar4 = ImVector<MyDocument_*>::operator[]
                                    (&ShowExampleAppDocuments::close_queue,local_80);
                ImGui::Text("%s",(*ppMVar4)->Name);
              }
            }
            ImGui::ListBoxFooter();
          }
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,80.0,0.0);
          bVar1 = ImGui::Button("Yes",(ImVec2 *)&stack0xffffffffffffff78);
          if (bVar1) {
            for (local_8c = 0; local_8c < ShowExampleAppDocuments::close_queue.Size;
                local_8c = local_8c + 1) {
              ppMVar4 = ImVector<MyDocument_*>::operator[]
                                  (&ShowExampleAppDocuments::close_queue,local_8c);
              if (((*ppMVar4)->Dirty & 1U) != 0) {
                ppMVar4 = ImVector<MyDocument_*>::operator[]
                                    (&ShowExampleAppDocuments::close_queue,local_8c);
                MyDocument::DoSave(*ppMVar4);
              }
              ppMVar4 = ImVector<MyDocument_*>::operator[]
                                  (&ShowExampleAppDocuments::close_queue,local_8c);
              MyDocument::DoForceClose(*ppMVar4);
            }
            ImVector<MyDocument_*>::clear(&ShowExampleAppDocuments::close_queue);
            ImGui::CloseCurrentPopup();
          }
          ImGui::SameLine(0.0,-1.0);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff6c,80.0,0.0);
          bVar1 = ImGui::Button("No",(ImVec2 *)&stack0xffffffffffffff6c);
          if (bVar1) {
            for (local_98 = 0; local_98 < ShowExampleAppDocuments::close_queue.Size;
                local_98 = local_98 + 1) {
              ppMVar4 = ImVector<MyDocument_*>::operator[]
                                  (&ShowExampleAppDocuments::close_queue,local_98);
              MyDocument::DoForceClose(*ppMVar4);
            }
            ImVector<MyDocument_*>::clear(&ShowExampleAppDocuments::close_queue);
            ImGui::CloseCurrentPopup();
          }
          ImGui::SameLine(0.0,-1.0);
          ImVec2::ImVec2(&local_a0,80.0,0.0);
          bVar1 = ImGui::Button("Cancel",&local_a0);
          if (bVar1) {
            ImVector<MyDocument_*>::clear(&ShowExampleAppDocuments::close_queue);
            ImGui::CloseCurrentPopup();
          }
          ImGui::EndPopup();
        }
      }
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

void ShowExampleAppDocuments(bool* p_open)
{
    static ExampleAppDocuments app;

    // Options
    static bool opt_reorderable = true;
    static ImGuiTabBarFlags opt_fitting_flags = ImGuiTabBarFlags_FittingPolicyDefault_;

    bool window_contents_visible = ImGui::Begin("Example: Documents", p_open, ImGuiWindowFlags_MenuBar);
    if (!window_contents_visible)
    {
        ImGui::End();
        return;
    }

    // Menu
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("File"))
        {
            int open_count = 0;
            for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
                open_count += app.Documents[doc_n].Open ? 1 : 0;

            if (ImGui::BeginMenu("Open", open_count < app.Documents.Size))
            {
                for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
                {
                    MyDocument* doc = &app.Documents[doc_n];
                    if (!doc->Open)
                        if (ImGui::MenuItem(doc->Name))
                            doc->DoOpen();
                }
                ImGui::EndMenu();
            }
            if (ImGui::MenuItem("Close All Documents", NULL, false, open_count > 0))
                for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
                    app.Documents[doc_n].DoQueueClose();
            if (ImGui::MenuItem("Exit", "Alt+F4")) {}
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    // [Debug] List documents with one checkbox for each
    for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
    {
        MyDocument* doc = &app.Documents[doc_n];
        if (doc_n > 0)
            ImGui::SameLine();
        ImGui::PushID(doc);
        if (ImGui::Checkbox(doc->Name, &doc->Open))
            if (!doc->Open)
                doc->DoForceClose();
        ImGui::PopID();
    }

    ImGui::Separator();

    // Submit Tab Bar and Tabs
    {
        ImGuiTabBarFlags tab_bar_flags = (opt_fitting_flags) | (opt_reorderable ? ImGuiTabBarFlags_Reorderable : 0);
        if (ImGui::BeginTabBar("##tabs", tab_bar_flags))
        {
            if (opt_reorderable)
                NotifyOfDocumentsClosedElsewhere(app);

            // [DEBUG] Stress tests
            //if ((ImGui::GetFrameCount() % 30) == 0) docs[1].Open ^= 1;            // [DEBUG] Automatically show/hide a tab. Test various interactions e.g. dragging with this on.
            //if (ImGui::GetIO().KeyCtrl) ImGui::SetTabItemSelected(docs[1].Name);  // [DEBUG] Test SetTabItemSelected(), probably not very useful as-is anyway..

            // Submit Tabs
            for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
            {
                MyDocument* doc = &app.Documents[doc_n];
                if (!doc->Open)
                    continue;

                ImGuiTabItemFlags tab_flags = (doc->Dirty ? ImGuiTabItemFlags_UnsavedDocument : 0);
                bool visible = ImGui::BeginTabItem(doc->Name, &doc->Open, tab_flags);

                // Cancel attempt to close when unsaved add to save queue so we can display a popup.
                if (!doc->Open && doc->Dirty)
                {
                    doc->Open = true;
                    doc->DoQueueClose();
                }

                MyDocument::DisplayContextMenu(doc);
                if (visible)
                {
                    MyDocument::DisplayContents(doc);
                    ImGui::EndTabItem();
                }
            }

            ImGui::EndTabBar();
        }
    }

    // Update closing queue
    static ImVector<MyDocument*> close_queue;
    if (close_queue.empty())
    {
        // Close queue is locked once we started a popup
        for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
        {
            MyDocument* doc = &app.Documents[doc_n];
            if (doc->WantClose)
            {
                doc->WantClose = false;
                close_queue.push_back(doc);
            }
        }
    }

    // Display closing confirmation UI
    if (!close_queue.empty())
    {
        int close_queue_unsaved_documents = 0;
        for (int n = 0; n < close_queue.Size; n++)
            if (close_queue[n]->Dirty)
                close_queue_unsaved_documents++;

        if (close_queue_unsaved_documents == 0)
        {
            // Close documents when all are unsaved
            for (int n = 0; n < close_queue.Size; n++)
                close_queue[n]->DoForceClose();
            close_queue.clear();
        }
        else
        {
            if (!ImGui::IsPopupOpen("Save?"))
                ImGui::OpenPopup("Save?");
            if (ImGui::BeginPopupModal("Save?"))
            {
                ImGui::Text("Save change to the following items?");
                ImGui::SetNextItemWidth(-1.0f);
                if (ImGui::ListBoxHeader("##", close_queue_unsaved_documents, 6))
                {
                    for (int n = 0; n < close_queue.Size; n++)
                        if (close_queue[n]->Dirty)
                            ImGui::Text("%s", close_queue[n]->Name);
                    ImGui::ListBoxFooter();
                }

                if (ImGui::Button("Yes", ImVec2(80, 0)))
                {
                    for (int n = 0; n < close_queue.Size; n++)
                    {
                        if (close_queue[n]->Dirty)
                            close_queue[n]->DoSave();
                        close_queue[n]->DoForceClose();
                    }
                    close_queue.clear();
                    ImGui::CloseCurrentPopup();
                }
                ImGui::SameLine();
                if (ImGui::Button("No", ImVec2(80, 0)))
                {
                    for (int n = 0; n < close_queue.Size; n++)
                        close_queue[n]->DoForceClose();
                    close_queue.clear();
                    ImGui::CloseCurrentPopup();
                }
                ImGui::SameLine();
                if (ImGui::Button("Cancel", ImVec2(80, 0)))
                {
                    close_queue.clear();
                    ImGui::CloseCurrentPopup();
                }
                ImGui::EndPopup();
            }
        }
    }

    ImGui::End();
}